

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O2

void __thiscall Object::externalProjector(Object *this,Edge *src,Vector2d *obs)

{
  bool bVar1;
  pointer pEVar2;
  unsigned_long uVar3;
  long lVar4;
  bool *pbVar5;
  HeapType heap;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  EdgeCompFunctor local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.egs = &this->edges;
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::priority_queue(&heap,&local_38,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  for (local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_start <
      (pointer)(((long)(this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x60);
      local_58._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)local_58._M_impl.super__Vector_impl_data._M_start + 1)) {
    std::
    priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
    ::emplace<unsigned_long&>
              ((priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
                *)&heap,(unsigned_long *)&local_58);
  }
  while (pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                  super__Vector_impl_data._M_start,
        heap.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        heap.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    uVar3 = *heap.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
    ::pop(&heap);
    if (pEVar2[uVar3].valid != false) {
      projectEdge2Edge(this,src,obs,pEVar2 + uVar3,&heap);
    }
  }
  lVar4 = ((long)(this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pEVar2) / 0x60 + 1;
  pbVar5 = &pEVar2->valid;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      this->valid = false;
      break;
    }
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 0x60;
  } while (bVar1 == false);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&heap);
  return;
}

Assistant:

void Object::externalProjector(Edge& src, const Eigen::Vector2d& obs) {
    HeapType heap(edges);
    for (size_t i = 0; i < edges.size(); i++)
        heap.emplace(i);
    while (heap.empty() == false) {
        size_t top = heap.top();
        Edge& this_edge = edges[top];
        heap.pop();
        if (this_edge.valid == false) continue;
        projectEdge2Edge(src, obs, this_edge, heap);
    }
    bool valid_flag = false;
    for (size_t i = 0; i < edges.size(); i++) {
        if (edges[i].valid == true) {
            valid_flag = true;
            break;
        }
    }
    if (valid_flag == false)                    // 假如全部被遮挡，那么这个object就没有投影的必要了
        valid = false;
}